

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_array.h
# Opt level: O1

void __thiscall
gtl::compact_array_base<int,_std::allocator<int>_>::set_size
          (compact_array_base<int,_std::allocator<int>_> *this,size_type_conflict n)

{
  uint uVar1;
  uint uVar2;
  S2LogMessage SStack_18;
  
  uVar1 = *(uint *)this >> 0x18 & 0x3f;
  uVar2 = 1 << ((byte)uVar1 & 0x1f);
  if ((*(uint *)this >> 0x1e & 1) == 0) {
    uVar2 = uVar1;
  }
  if (n <= uVar2) {
    *(size_type_conflict *)this = n & 0xffffff | (uint)(byte)this->field_0x3 << 0x18;
    return;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/compact_array.h"
             ,0x167,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_18.stream_,"Check failed: (n) <= (capacity()) ",0x22);
  abort();
}

Assistant:

size_type capacity() const {
    return is_exponent_ ? (1 << capacity_) : capacity_;
  }